

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderCsc::LossyDctEncoderCsc
          (LossyDctEncoderCsc *this,float quantBaseError,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsR,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsG,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsB,char *packedAc,
          char *packedDc,unsigned_short *toNonlinear,int width,int height,PixelType typeR,
          PixelType typeG,PixelType typeB)

{
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *this_00;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  PixelType PVar3;
  PixelType PVar4;
  long lVar5;
  PixelType *pPVar6;
  iterator iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  PVar4 = typeB;
  PVar3 = typeG;
  (this->super_LossyDctEncoderBase)._vptr_LossyDctEncoderBase =
       (_func_int **)&PTR__LossyDctEncoderBase_003e16b8;
  (this->super_LossyDctEncoderBase)._quantBaseError = quantBaseError;
  (this->super_LossyDctEncoderBase)._width = width;
  (this->super_LossyDctEncoderBase)._height = height;
  (this->super_LossyDctEncoderBase)._toNonlinear = toNonlinear;
  (this->super_LossyDctEncoderBase)._numAcComp = 0;
  (this->super_LossyDctEncoderBase)._numDcComp = 0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._packedAc = packedAc;
  (this->super_LossyDctEncoderBase)._packedDc = packedDc;
  auVar2 = _DAT_001c9760;
  auVar1 = _DAT_001c9750;
  lVar5 = 0;
  do {
    auVar8._0_4_ = (float)*(int *)(&DAT_001e9a40 + lVar5);
    auVar8._4_4_ = (float)*(int *)(&UNK_001e9a44 + lVar5);
    auVar8._8_4_ = (float)*(int *)(&UNK_001e9a48 + lVar5);
    auVar8._12_4_ = (float)*(int *)(&UNK_001e9a4c + lVar5);
    auVar8 = divps(auVar8,auVar1);
    *(undefined1 (*) [16])((long)(this->super_LossyDctEncoderBase)._quantTableY + lVar5) = auVar8;
    auVar9._0_4_ = (float)*(int *)(&DAT_001e9b40 + lVar5);
    auVar9._4_4_ = (float)*(int *)(&UNK_001e9b44 + lVar5);
    auVar9._8_4_ = (float)*(int *)(&UNK_001e9b48 + lVar5);
    auVar9._12_4_ = (float)*(int *)(&UNK_001e9b4c + lVar5);
    auVar8 = divps(auVar9,auVar2);
    *(undefined1 (*) [16])((long)(this->super_LossyDctEncoderBase)._quantTableCbCr + lVar5) = auVar8
    ;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x100);
  (this->super_LossyDctEncoderBase)._vptr_LossyDctEncoderBase =
       (_func_int **)&PTR__LossyDctEncoderBase_003e1760;
  this_00 = &(this->super_LossyDctEncoderBase)._type;
  std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
  _M_realloc_insert<Imf_2_5::PixelType_const&>
            ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,(iterator)0x0,
             &typeR);
  iVar7._M_current =
       (this->super_LossyDctEncoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pPVar6 = (this->super_LossyDctEncoderBase)._type.
           super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar7._M_current == pPVar6) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,iVar7,&typeG
              );
    iVar7._M_current =
         (this->super_LossyDctEncoderBase)._type.
         super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pPVar6 = (this->super_LossyDctEncoderBase)._type.
             super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar7._M_current = PVar3;
    iVar7._M_current = iVar7._M_current + 1;
    (this->super_LossyDctEncoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current;
  }
  if (iVar7._M_current == pPVar6) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,iVar7,&typeB
              );
  }
  else {
    *iVar7._M_current = PVar4;
    (this->super_LossyDctEncoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  this_01 = &(this->super_LossyDctEncoderBase)._rowPtrs;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsR);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsG);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsB);
  return;
}

Assistant:

LossyDctEncoderCsc
        (float quantBaseError,
         std::vector<const char *> &rowPtrsR,
         std::vector<const char *> &rowPtrsG,
         std::vector<const char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toNonlinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctEncoderBase
            (quantBaseError, packedAc, packedDc, toNonlinear, width, height)
    {
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);

        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
    }